

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void * arena_ralloc(tsdn_t *tsdn,arena_t *arena,void *ptr,size_t oldsize,size_t size,
                   size_t alignment,_Bool zero,tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  cache_bin_stats_t *pcVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  uintptr_t uVar6;
  undefined8 uVar7;
  cache_bin_info_t *pcVar8;
  _Bool _Var9;
  szind_t sVar10;
  uint uVar11;
  ulong uVar12;
  void *pvVar13;
  arena_t *paVar14;
  rtree_leaf_elm_t *prVar15;
  ulong uVar16;
  rtree_ctx_t *ctx;
  int iVar17;
  long lVar18;
  size_t sVar19;
  cache_bin_t *tbin;
  size_t usize;
  size_t newsize;
  
  if (size < 0x1001) {
    usize = sz_index2size_tab[sz_size2index_tab[size + 7 >> 3]];
  }
  else {
    if (0x7000000000000000 < size) {
      return (void *)0x0;
    }
    uVar12 = size * 2 - 1;
    lVar18 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    uVar12 = ~(-1L << ((char)lVar18 - 3U & 0x3f));
    if ((uint)lVar18 < 7) {
      uVar12 = 0xf;
    }
    usize = ~uVar12 & size + uVar12;
  }
  if (usize == 0) {
    return (void *)0x0;
  }
  if (usize < 0x3801) {
    _Var9 = arena_ralloc_no_move(tsdn,ptr,oldsize,usize,0,zero,&newsize);
    if (!_Var9) {
      hook_invoke_expand(hook_args->is_realloc ^ hook_expand_rallocx,ptr,oldsize,usize,
                         (uintptr_t)ptr,hook_args->args);
      return ptr;
    }
  }
  else if ((0x3fff < oldsize) && (0x3fff < usize)) {
    pvVar13 = large_ralloc(tsdn,arena,ptr,usize,alignment,zero,tcache,hook_args);
    return pvVar13;
  }
  if (alignment == 0) {
    if (usize < 0x1001) {
      sVar10 = (szind_t)sz_size2index_tab[usize + 7 >> 3];
    }
    else {
      sVar10 = sz_size2index_compute(usize);
    }
    if (tcache == (tcache_t *)0x0) {
LAB_00110dc1:
      pvVar13 = arena_malloc_hard(tsdn,arena,usize,sVar10,zero);
    }
    else {
      if (usize < 0x3801) {
        tbin = tcache->bins_small + sVar10;
        iVar5 = tcache->bins_small[sVar10].ncached;
        iVar17 = iVar5 + -1;
        tcache->bins_small[sVar10].ncached = iVar17;
        if ((tbin->low_water < iVar17) || (tbin->low_water = iVar17, iVar5 != 0)) {
          pvVar13 = tcache->bins_small[sVar10].avail[-iVar5];
        }
        else {
          tcache->bins_small[sVar10].ncached = 0;
          paVar14 = arena_choose(&tsdn->tsd,arena);
          if (paVar14 == (arena_t *)0x0) {
            return (void *)0x0;
          }
          pvVar13 = tcache_alloc_small_hard(tsdn,paVar14,tcache,tbin,sVar10,(_Bool *)&newsize);
          if ((char)newsize == '\0') {
            return (void *)0x0;
          }
        }
        sVar19 = sz_index2size_tab[sVar10];
        if (zero) {
LAB_00110b7e:
          iVar17 = 0;
LAB_00110e7d:
          memset(pvVar13,iVar17,sVar19);
        }
        else {
          if (opt_junk_alloc == true) {
            sVar19 = bin_infos[sVar10].reg_size;
            iVar17 = 0xa5;
            goto LAB_00110e7d;
          }
          if (opt_zero == true) goto LAB_00110b7e;
        }
        pcVar1 = &tcache->bins_small[sVar10].tstats;
        pcVar1->nrequests = pcVar1->nrequests + 1;
        iVar17 = (tcache->gc_ticker).tick;
        (tcache->gc_ticker).tick = iVar17 + -1;
        if (0 < iVar17) goto LAB_001109e8;
        (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
      }
      else {
        if (tcache_maxclass < usize) goto LAB_00110dc1;
        iVar5 = tcache->bins_small[(ulong)sVar10 + 5].ncached;
        iVar17 = iVar5 + -1;
        tcache->bins_small[(ulong)sVar10 + 5].ncached = iVar17;
        if ((tcache->bins_small[(ulong)sVar10 + 5].low_water < iVar17) ||
           (tcache->bins_small[(ulong)sVar10 + 5].low_water = iVar17, iVar5 != 0)) {
          pvVar13 = tcache->bins_small[(ulong)sVar10 + 5].avail[-iVar5];
          if (zero) {
LAB_00110f33:
            iVar17 = 0;
LAB_00111042:
            memset(pvVar13,iVar17,sz_index2size_tab[sVar10]);
          }
          else {
            if (opt_junk_alloc == true) {
              iVar17 = 0xa5;
              goto LAB_00111042;
            }
            if (opt_zero == true) goto LAB_00110f33;
          }
          pcVar1 = &tcache->bins_small[(ulong)sVar10 + 5].tstats;
          pcVar1->nrequests = pcVar1->nrequests + 1;
        }
        else {
          tcache->bins_small[(ulong)sVar10 + 5].ncached = 0;
          paVar14 = arena_choose(&tsdn->tsd,arena);
          if (paVar14 == (arena_t *)0x0) {
            return (void *)0x0;
          }
          if (usize < 0x7000000000000001) {
            uVar12 = usize * 2 - 1;
            lVar18 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
              }
            }
            uVar12 = ~(-1L << ((char)lVar18 - 3U & 0x3f));
            if ((uint)lVar18 < 7) {
              uVar12 = 0xf;
            }
            sVar19 = ~uVar12 & uVar12 + usize;
          }
          else {
            sVar19 = 0;
          }
          pvVar13 = large_malloc(tsdn,paVar14,sVar19,zero);
          if (pvVar13 == (void *)0x0) {
            return (void *)0x0;
          }
        }
        iVar17 = (tcache->gc_ticker).tick;
        (tcache->gc_ticker).tick = iVar17 + -1;
        if (0 < iVar17) goto LAB_001109e8;
        (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
      }
      tcache_event_hard(&tsdn->tsd,tcache);
    }
  }
  else {
    if ((alignment < 0x1000) && (usize < 0x3801)) {
      uVar12 = -alignment & (alignment + usize) - 1;
      if (uVar12 < 0x1001) {
        sVar19 = sz_index2size_tab[sz_size2index_tab[uVar12 + 7 >> 3]];
      }
      else {
        uVar16 = uVar12 * 2 - 1;
        lVar18 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar18 == 0; lVar18 = lVar18 + -1) {
          }
        }
        uVar16 = ~(-1L << ((char)lVar18 - 3U & 0x3f));
        if ((uint)lVar18 < 7) {
          uVar16 = 0xf;
        }
        sVar19 = ~uVar16 & uVar12 + uVar16;
      }
      uVar12 = 0x4000;
      if (0x3fff < sVar19) goto LAB_00110986;
    }
    else {
      if (0x7000000000000000 < alignment) {
        return (void *)0x0;
      }
      uVar12 = 0x4000;
      if (0x4000 < usize) {
        if (usize < 0x7000000000000001) {
          uVar12 = usize * 2 - 1;
          lVar18 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          uVar12 = ~(-1L << ((char)lVar18 - 3U & 0x3f));
          if ((uint)lVar18 < 7) {
            uVar12 = 0xf;
          }
          uVar12 = ~uVar12 & uVar12 + usize;
        }
        else {
          uVar12 = 0;
        }
        if (uVar12 < usize) {
          return (void *)0x0;
        }
      }
LAB_00110986:
      sVar19 = 0;
      if (uVar12 <= (0x7ffffffffffff000 - alignment | 0x8000000000000fff)) {
        sVar19 = uVar12;
      }
    }
    if (sVar19 + 0x8fffffffffffffff < 0x9000000000000000) {
      return (void *)0x0;
    }
    pvVar13 = arena_palloc(tsdn,arena,sVar19,alignment,zero,tcache);
  }
LAB_001109e8:
  if (pvVar13 == (void *)0x0) {
    return (void *)0x0;
  }
  hook_invoke_alloc(hook_alloc_rallocx - hook_args->is_realloc,pvVar13,(uintptr_t)pvVar13,
                    hook_args->args);
  hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (oldsize <= usize) {
    usize = oldsize;
  }
  memcpy(pvVar13,ptr,usize);
  if (tcache == (tcache_t *)0x0) {
    if (oldsize < 0x1001) {
      uVar11 = (uint)sz_size2index_tab[oldsize + 7 >> 3];
    }
    else {
      uVar11 = sz_size2index_compute(oldsize);
    }
    if (uVar11 < 0x24) {
      arena_dalloc_small(tsdn,ptr);
      return pvVar13;
    }
    if (tsdn == (tsdn_t *)0x0) {
      ctx = (rtree_ctx_t *)&newsize;
      rtree_ctx_data_init(ctx);
    }
    else {
      ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar12 = (ulong)ptr & 0xffffffffc0000000;
    uVar16 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
    puVar2 = (ulong *)((long)&ctx->cache[0].leafkey + uVar16);
    uVar6 = *(uintptr_t *)((long)&ctx->cache[0].leafkey + uVar16);
    if (uVar6 == uVar12) {
      prVar15 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
      goto LAB_00110f10;
    }
    if (ctx->l2_cache[0].leafkey != uVar12) {
      for (lVar18 = 0x118; lVar18 != 0x188; lVar18 = lVar18 + 0x10) {
        if (*(ulong *)((long)ctx->cache + lVar18 + -8) == uVar12) {
          uVar16 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar18);
          puVar3 = (undefined8 *)((long)ctx->cache + lVar18 + -0x18);
          uVar7 = puVar3[1];
          puVar4 = (undefined8 *)((long)ctx->cache + lVar18 + -8);
          *puVar4 = *puVar3;
          puVar4[1] = uVar7;
          *(uintptr_t *)((long)ctx->cache + lVar18 + -0x18) = uVar6;
          *(ulong *)((long)(ctx->cache + -1) + lVar18) = puVar2[1];
          *puVar2 = uVar12;
          puVar2[1] = uVar16;
          goto LAB_0011115b;
        }
      }
LAB_00111192:
      prVar15 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,ctx,(uintptr_t)ptr,true,false);
      goto LAB_00110f10;
    }
    prVar15 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar6;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = uVar12;
    puVar2[1] = (ulong)prVar15;
  }
  else {
    if (oldsize < 0x1001) {
      sVar10 = (szind_t)sz_size2index_tab[oldsize + 7 >> 3];
    }
    else {
      sVar10 = sz_size2index_compute(oldsize);
    }
    if (sVar10 < 0x24) {
      if (opt_junk_free == true) {
        memset(ptr,0x5a,bin_infos[sVar10].reg_size);
      }
      pcVar8 = tcache_bin_info;
      uVar11 = tcache->bins_small[sVar10].ncached;
      if (uVar11 == tcache_bin_info[sVar10].ncached_max) {
        tcache_bin_flush_small
                  (&tsdn->tsd,tcache,tcache->bins_small + sVar10,sVar10,(int)uVar11 >> 1);
        uVar11 = tcache->bins_small[sVar10].ncached;
        if (uVar11 != pcVar8[sVar10].ncached_max) goto LAB_00110ac5;
      }
      else {
LAB_00110ac5:
        tcache->bins_small[sVar10].ncached = uVar11 + 1;
        tcache->bins_small[sVar10].avail[(int)~uVar11] = ptr;
      }
      iVar17 = (tcache->gc_ticker).tick;
      (tcache->gc_ticker).tick = iVar17 + -1;
      if (0 < iVar17) {
        return pvVar13;
      }
      (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
LAB_00110af5:
      tcache_event_hard(&tsdn->tsd,tcache);
      return pvVar13;
    }
    if (sVar10 < nhbins) {
      if (opt_junk_free != false) {
        large_dalloc_junk_impl(ptr,sz_index2size_tab[sVar10]);
      }
      uVar11 = tcache->bins_small[(ulong)sVar10 + 5].ncached;
      if (uVar11 == tcache_bin_info[sVar10].ncached_max) {
        tcache_bin_flush_large
                  (&tsdn->tsd,tcache->bins_small + (ulong)sVar10 + 5,sVar10,(int)uVar11 >> 1,tcache)
        ;
        uVar11 = tcache->bins_small[(ulong)sVar10 + 5].ncached;
      }
      tcache->bins_small[(ulong)sVar10 + 5].ncached = uVar11 + 1;
      tcache->bins_small[(ulong)sVar10 + 5].avail[(int)~uVar11] = ptr;
      iVar17 = (tcache->gc_ticker).tick;
      (tcache->gc_ticker).tick = iVar17 + -1;
      if (0 < iVar17) {
        return pvVar13;
      }
      (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
      goto LAB_00110af5;
    }
    if (tsdn == (tsdn_t *)0x0) {
      ctx = (rtree_ctx_t *)&newsize;
      rtree_ctx_data_init(ctx);
    }
    else {
      ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar12 = (ulong)ptr & 0xffffffffc0000000;
    uVar16 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
    puVar2 = (ulong *)((long)&ctx->cache[0].leafkey + uVar16);
    uVar6 = *(uintptr_t *)((long)&ctx->cache[0].leafkey + uVar16);
    if (uVar6 == uVar12) {
      prVar15 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
      goto LAB_00110f10;
    }
    if (ctx->l2_cache[0].leafkey != uVar12) {
      for (lVar18 = 0x118; lVar18 != 0x188; lVar18 = lVar18 + 0x10) {
        if (*(ulong *)((long)ctx->cache + lVar18 + -8) == uVar12) {
          uVar16 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar18);
          puVar3 = (undefined8 *)((long)ctx->cache + lVar18 + -0x18);
          uVar7 = puVar3[1];
          puVar4 = (undefined8 *)((long)ctx->cache + lVar18 + -8);
          *puVar4 = *puVar3;
          puVar4[1] = uVar7;
          *(uintptr_t *)((long)ctx->cache + lVar18 + -0x18) = uVar6;
          *(ulong *)((long)(ctx->cache + -1) + lVar18) = puVar2[1];
          *puVar2 = uVar12;
          puVar2[1] = uVar16;
LAB_0011115b:
          prVar15 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar16);
          goto LAB_00110f10;
        }
      }
      goto LAB_00111192;
    }
    prVar15 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar6;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = uVar12;
    puVar2[1] = (ulong)prVar15;
  }
  prVar15 = (rtree_leaf_elm_t *)
            ((long)&(prVar15->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_00110f10:
  large_dalloc(tsdn,(extent_t *)
                    (((long)(prVar15->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe));
  return pvVar13;
}

Assistant:

void *
arena_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t oldsize,
    size_t size, size_t alignment, bool zero, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	size_t usize = sz_s2u(size);
	if (unlikely(usize == 0 || size > SC_LARGE_MAXCLASS)) {
		return NULL;
	}

	if (likely(usize <= SC_SMALL_MAXCLASS)) {
		/* Try to avoid moving the allocation. */
		UNUSED size_t newsize;
		if (!arena_ralloc_no_move(tsdn, ptr, oldsize, usize, 0, zero,
		    &newsize)) {
			hook_invoke_expand(hook_args->is_realloc
			    ? hook_expand_realloc : hook_expand_rallocx,
			    ptr, oldsize, usize, (uintptr_t)ptr,
			    hook_args->args);
			return ptr;
		}
	}

	if (oldsize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS) {
		return large_ralloc(tsdn, arena, ptr, usize,
		    alignment, zero, tcache, hook_args);
	}

	/*
	 * size and oldsize are different enough that we need to move the
	 * object.  In that case, fall back to allocating new space and copying.
	 */
	void *ret = arena_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero, tcache);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	/*
	 * Junk/zero-filling were already done by
	 * ipalloc()/arena_malloc().
	 */
	size_t copysize = (usize < oldsize) ? usize : oldsize;
	memcpy(ret, ptr, copysize);
	isdalloct(tsdn, ptr, oldsize, tcache, NULL, true);
	return ret;
}